

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_async_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 in_R9;
  uv_async_t h;
  undefined1 auStack_370 [152];
  code *pcStack_2d8;
  undefined1 auStack_2c8 [152];
  code *pcStack_230;
  code *pcStack_228;
  undefined1 auStack_218 [120];
  code *pcStack_1a0;
  undefined1 auStack_190 [120];
  code *pcStack_118;
  undefined1 auStack_108 [120];
  code *pcStack_90;
  undefined1 auStack_88 [128];
  
  pcStack_90 = (code *)0x16914e;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x16915e;
  uv_async_init(uVar2,auStack_88,0);
  pcStack_90 = (code *)0x169166;
  uv_unref(auStack_88);
  pcStack_90 = (code *)0x16916b;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x169175;
  uv_run(uVar2,0);
  pcStack_90 = (code *)0x16917d;
  do_close(auStack_88);
  pcStack_90 = (code *)0x169182;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x169196;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_90 = (code *)0x1691a0;
  uv_run(uVar2,0);
  pcStack_90 = (code *)0x1691a5;
  uVar3 = uv_default_loop();
  pcStack_90 = (code *)0x1691ad;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_90 = run_test_prepare_ref;
  run_test_async_ref_cold_1();
  pcStack_118 = (code *)0x1691ce;
  pcStack_90 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x1691de;
  uv_prepare_init(uVar2,auStack_108);
  pcStack_118 = (code *)0x1691ed;
  uv_prepare_start(auStack_108,fail_cb2);
  pcStack_118 = (code *)0x1691f5;
  uv_unref(auStack_108);
  pcStack_118 = (code *)0x1691fa;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x169204;
  uv_run(uVar2,0);
  pcStack_118 = (code *)0x16920c;
  do_close(auStack_108);
  pcStack_118 = (code *)0x169211;
  uVar2 = uv_default_loop();
  pcStack_118 = (code *)0x169225;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_118 = (code *)0x16922f;
  uv_run(uVar2,0);
  pcStack_118 = (code *)0x169234;
  uVar3 = uv_default_loop();
  pcStack_118 = (code *)0x16923c;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_118 = run_test_check_ref;
  run_test_prepare_ref_cold_1();
  pcStack_1a0 = (code *)0x16925d;
  pcStack_118 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_1a0 = (code *)0x16926d;
  uv_check_init(uVar2,auStack_190);
  pcStack_1a0 = (code *)0x16927c;
  uv_check_start(auStack_190,fail_cb2);
  pcStack_1a0 = (code *)0x169284;
  uv_unref(auStack_190);
  pcStack_1a0 = (code *)0x169289;
  uVar2 = uv_default_loop();
  pcStack_1a0 = (code *)0x169293;
  uv_run(uVar2,0);
  pcStack_1a0 = (code *)0x16929b;
  do_close(auStack_190);
  pcStack_1a0 = (code *)0x1692a0;
  uVar2 = uv_default_loop();
  pcStack_1a0 = (code *)0x1692b4;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_1a0 = (code *)0x1692be;
  uv_run(uVar2,0);
  pcStack_1a0 = (code *)0x1692c3;
  uVar3 = uv_default_loop();
  pcStack_1a0 = (code *)0x1692cb;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_1a0 = run_test_unref_in_prepare_cb;
  run_test_check_ref_cold_1();
  pcStack_228 = (code *)0x1692ec;
  pcStack_1a0 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_228 = (code *)0x1692fc;
  uv_prepare_init(uVar2,auStack_218);
  pcStack_228 = (code *)0x16930b;
  uv_prepare_start(auStack_218,prepare_cb);
  pcStack_228 = (code *)0x169310;
  uVar2 = uv_default_loop();
  pcStack_228 = (code *)0x16931a;
  uv_run(uVar2,0);
  pcStack_228 = (code *)0x169322;
  do_close(auStack_218);
  pcStack_228 = (code *)0x169327;
  uVar2 = uv_default_loop();
  pcStack_228 = (code *)0x16933b;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_228 = (code *)0x169345;
  uv_run(uVar2,0);
  pcStack_228 = (code *)0x16934a;
  lVar4 = uv_default_loop();
  pcStack_228 = (code *)0x169352;
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_228 = prepare_cb;
  run_test_unref_in_prepare_cb_cold_1();
  if (lVar4 != 0) {
    iVar1 = uv_unref();
    return iVar1;
  }
  pcStack_230 = run_test_timer_ref;
  prepare_cb_cold_1();
  pcStack_2d8 = (code *)0x169382;
  pcStack_230 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_2d8 = (code *)0x169392;
  uv_timer_init(uVar2,auStack_2c8);
  pcStack_2d8 = (code *)0x16939a;
  uv_unref(auStack_2c8);
  pcStack_2d8 = (code *)0x16939f;
  uVar2 = uv_default_loop();
  pcStack_2d8 = (code *)0x1693a9;
  uv_run(uVar2,0);
  pcStack_2d8 = (code *)0x1693b1;
  do_close(auStack_2c8);
  pcStack_2d8 = (code *)0x1693b6;
  uVar2 = uv_default_loop();
  pcStack_2d8 = (code *)0x1693ca;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_2d8 = (code *)0x1693d4;
  uv_run(uVar2,0);
  pcStack_2d8 = (code *)0x1693d9;
  uVar3 = uv_default_loop();
  pcStack_2d8 = (code *)0x1693e1;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_2d8 = run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  pcStack_2d8 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,auStack_370);
  uv_timer_start(auStack_370,fail_cb,0x2a,0x2a);
  uv_unref(auStack_370);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(auStack_370);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,uVar2);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(async_ref) {
  uv_async_t h;
  uv_async_init(uv_default_loop(), &h, NULL);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}